

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O1

void __thiscall
flatbuffers::swift::SwiftGenerator::GenerateObjectAPITableExtension
          (SwiftGenerator *this,StructDef *struct_def)

{
  CodeWriter *this_00;
  Value *type_00;
  BaseType BVar1;
  int iVar2;
  FieldDef *field_def;
  StructDef *struct_def_00;
  pointer pcVar3;
  SwiftGenerator *pSVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  size_type *psVar8;
  char *pcVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  pointer pbVar12;
  pointer ppFVar13;
  IdlNamer *this_01;
  bool bVar14;
  string code;
  string builder;
  string field_var;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unpack_body;
  string body;
  string field_field;
  string check_if_vector;
  string type;
  string field_method;
  string local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  long *local_270 [2];
  long local_260 [2];
  SwiftGenerator *local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  CodeWriter *local_1f0;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  StructDef *local_1a8;
  string local_1a0;
  string local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  long *local_100 [2];
  long local_f0 [2];
  IdlNamer *local_e0;
  pointer local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_01 = &this->namer_;
  local_1a8 = struct_def;
  IdlNamer::NamespacedObjectType_abi_cxx11_(&local_50,this_01,&struct_def->super_Definition);
  GenerateObjectAPIExtensionHeader(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_270[0] = local_260;
  local_250 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,", &builder)","");
  ppFVar13 = (local_1a8->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar13 !=
      (local_1a8->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_1f0 = &local_250->code_;
    local_e0 = this_01;
    do {
      field_def = *ppFVar13;
      if (field_def->deprecated != false) goto LAB_002ed0d3;
      (*(this_01->super_Namer)._vptr_Namer[7])(&local_248,this_01,field_def);
      (*(this_01->super_Namer)._vptr_Namer[0x12])(&local_1e8,this_01,field_def);
      local_d8 = ppFVar13;
      (*(this_01->super_Namer)._vptr_Namer[4])(local_100,this_01,field_def);
      type_00 = &field_def->value;
      GenType_abi_cxx11_(&local_120,local_250,&type_00->type,false);
      BVar1 = (type_00->type).base_type;
      bVar14 = BVar1 - BASE_TYPE_ARRAY < 2;
      pcVar9 = "(";
      if (bVar14 || BVar1 == BASE_TYPE_VECTOR) {
        pcVar9 = "VectorOf(";
      }
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_140,pcVar9,
                 pcVar9 + (ulong)(bVar14 || BVar1 == BASE_TYPE_VECTOR) * 8 + 1);
      std::operator+(&local_2d0,"add",&local_140);
      plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_100[0]);
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      puVar7 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        local_2f0.field_2._M_allocated_capacity = *puVar7;
        local_2f0.field_2._8_8_ = plVar5[3];
      }
      else {
        local_2f0.field_2._M_allocated_capacity = *puVar7;
        local_2f0._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_2f0._M_string_length = plVar5[1];
      *plVar5 = (long)puVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2f0);
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_210.field_2._M_allocated_capacity = *psVar8;
        local_210.field_2._8_8_ = plVar5[3];
      }
      else {
        local_210.field_2._M_allocated_capacity = *psVar8;
        local_210._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_210._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      BVar1 = (type_00->type).base_type;
      switch(BVar1) {
      case BASE_TYPE_STRING:
        std::operator+(&local_290,"{{STRUCTNAME}}.",&local_210);
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        puVar7 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_2b0.field_2._M_allocated_capacity = *puVar7;
          local_2b0.field_2._8_8_ = puVar6[3];
        }
        else {
          local_2b0.field_2._M_allocated_capacity = *puVar7;
          local_2b0._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_2b0._M_string_length = puVar6[1];
        *puVar6 = puVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2b0,(ulong)local_248._M_dataplus._M_p);
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        psVar8 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_2d0.field_2._M_allocated_capacity = *psVar8;
          local_2d0.field_2._8_8_ = puVar6[3];
        }
        else {
          local_2d0.field_2._M_allocated_capacity = *psVar8;
          local_2d0._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_2d0._M_string_length = puVar6[1];
        *puVar6 = psVar8;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_270[0]);
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        puVar7 = (ulong *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_2f0.field_2._M_allocated_capacity = *puVar7;
          local_2f0.field_2._8_8_ = plVar5[3];
        }
        else {
          local_2f0.field_2._M_allocated_capacity = *puVar7;
          local_2f0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_2f0._M_string_length = plVar5[1];
        *plVar5 = (long)puVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228,
                   &local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
        if (field_def->presence != kRequired) {
          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2f0,"builder.create(string: s)","");
          BuildingOptionalObjects(local_250,&local_1e8,&local_2f0);
          goto LAB_002ecbc6;
        }
        std::operator+(&local_2b0,"let __",&local_248);
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        psVar8 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_2d0.field_2._M_allocated_capacity = *psVar8;
          local_2d0.field_2._8_8_ = puVar6[3];
        }
        else {
          local_2d0.field_2._M_allocated_capacity = *psVar8;
          local_2d0._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_2d0._M_string_length = puVar6[1];
        *puVar6 = psVar8;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2d0,(ulong)local_1e8._M_dataplus._M_p);
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        puVar7 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_2f0.field_2._M_allocated_capacity = *puVar7;
          local_2f0.field_2._8_8_ = puVar6[3];
        }
        else {
          local_2f0.field_2._M_allocated_capacity = *puVar7;
          local_2f0._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_2f0._M_string_length = puVar6[1];
        *puVar6 = puVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_2f0);
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_1a0.field_2._M_allocated_capacity = *psVar8;
          local_1a0.field_2._8_8_ = plVar5[3];
        }
        else {
          local_1a0.field_2._M_allocated_capacity = *psVar8;
          local_1a0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1a0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        CodeWriter::operator+=(local_1f0,&local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        uVar10 = local_2b0.field_2._M_allocated_capacity;
        _Var11._M_p = local_2b0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p == &local_2b0.field_2) break;
        goto LAB_002ecfe5;
      case BASE_TYPE_VECTOR:
      case BASE_TYPE_ARRAY:
        GenerateVectorObjectAPITableExtension(local_250,field_def);
        std::operator+(&local_290,"{{STRUCTNAME}}.",&local_210);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_290);
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        puVar7 = (ulong *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_2b0.field_2._M_allocated_capacity = *puVar7;
          local_2b0.field_2._8_8_ = plVar5[3];
        }
        else {
          local_2b0.field_2._M_allocated_capacity = *puVar7;
          local_2b0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_2b0._M_string_length = plVar5[1];
        *plVar5 = (long)puVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_2b0,(ulong)local_248._M_dataplus._M_p);
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_2d0.field_2._M_allocated_capacity = *psVar8;
          local_2d0.field_2._8_8_ = plVar5[3];
        }
        else {
          local_2d0.field_2._M_allocated_capacity = *psVar8;
          local_2d0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_2d0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_270[0]);
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        puVar7 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_2f0.field_2._M_allocated_capacity = *puVar7;
          local_2f0.field_2._8_8_ = puVar6[3];
        }
        else {
          local_2f0.field_2._M_allocated_capacity = *puVar7;
          local_2f0._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_2f0._M_string_length = puVar6[1];
        *puVar6 = puVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228,
                   &local_2f0);
LAB_002ecf7d:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        uVar10 = local_290.field_2._M_allocated_capacity;
        _Var11._M_p = local_290._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) goto LAB_002ecfe5;
        break;
      case BASE_TYPE_STRUCT:
        struct_def_00 = (field_def->value).type.struct_def;
        if ((struct_def_00 == (StructDef *)0x0) || (struct_def_00->fixed != true)) {
          std::operator+(&local_1c8,"let __",&local_248);
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
          local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
          puVar7 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar7) {
            local_290.field_2._M_allocated_capacity = *puVar7;
            local_290.field_2._8_8_ = puVar6[3];
          }
          else {
            local_290.field_2._M_allocated_capacity = *puVar7;
            local_290._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_290._M_string_length = puVar6[1];
          *puVar6 = puVar7;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_290,(ulong)local_120._M_dataplus._M_p);
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          psVar8 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_2b0.field_2._M_allocated_capacity = *psVar8;
            local_2b0.field_2._8_8_ = plVar5[3];
          }
          else {
            local_2b0.field_2._M_allocated_capacity = *psVar8;
            local_2b0._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_2b0._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b0);
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          psVar8 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_2d0.field_2._M_allocated_capacity = *psVar8;
            local_2d0.field_2._8_8_ = plVar5[3];
          }
          else {
            local_2d0.field_2._M_allocated_capacity = *psVar8;
            local_2d0._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_2d0._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_2d0,(ulong)local_1e8._M_dataplus._M_p);
          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          psVar8 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_2f0.field_2._M_allocated_capacity = *psVar8;
            local_2f0.field_2._8_8_ = plVar5[3];
          }
          else {
            local_2f0.field_2._M_allocated_capacity = *psVar8;
            local_2f0._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_2f0._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_2f0);
          psVar8 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_160.field_2._M_allocated_capacity = *psVar8;
            local_160.field_2._8_8_ = plVar5[3];
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          }
          else {
            local_160.field_2._M_allocated_capacity = *psVar8;
            local_160._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_160._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          CodeWriter::operator+=(local_1f0,&local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
            operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p != &local_290.field_2) {
            operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_290,"{{STRUCTNAME}}.",&local_210);
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          puVar7 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar7) {
            local_2b0.field_2._M_allocated_capacity = *puVar7;
            local_2b0.field_2._8_8_ = puVar6[3];
          }
          else {
            local_2b0.field_2._M_allocated_capacity = *puVar7;
            local_2b0._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_2b0._M_string_length = puVar6[1];
          *puVar6 = puVar7;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_2b0,(ulong)local_248._M_dataplus._M_p);
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          psVar8 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_2d0.field_2._M_allocated_capacity = *psVar8;
            local_2d0.field_2._8_8_ = puVar6[3];
          }
          else {
            local_2d0.field_2._M_allocated_capacity = *psVar8;
            local_2d0._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_2d0._M_string_length = puVar6[1];
          *puVar6 = psVar8;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_270[0]);
          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          puVar7 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar7) {
            local_2f0.field_2._M_allocated_capacity = *puVar7;
            local_2f0.field_2._8_8_ = puVar6[3];
          }
          else {
            local_2f0.field_2._M_allocated_capacity = *puVar7;
            local_2f0._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_2f0._M_string_length = puVar6[1];
          *puVar6 = puVar7;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228
                     ,&local_2f0);
          goto LAB_002ecf7d;
        }
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        local_2f0._M_string_length = 0;
        local_2f0.field_2._M_allocated_capacity =
             local_2f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"","");
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"","");
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"$0","");
        GenerateStructArgs(local_250,struct_def_00,&local_2f0,&local_2d0,&local_2b0,&local_290,true)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::substr((ulong)&local_2d0,(ulong)&local_2f0);
        std::__cxx11::string::operator=((string *)&local_2f0,(string *)&local_2d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_1c8,"{{STRUCTNAME}}.",&local_210);
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        puVar7 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_290.field_2._M_allocated_capacity = *puVar7;
          local_290.field_2._8_8_ = puVar6[3];
        }
        else {
          local_290.field_2._M_allocated_capacity = *puVar7;
          local_290._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_290._M_string_length = puVar6[1];
        *puVar6 = puVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_290,(ulong)local_1e8._M_dataplus._M_p);
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        puVar7 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_2b0.field_2._M_allocated_capacity = *puVar7;
          local_2b0.field_2._8_8_ = puVar6[3];
        }
        else {
          local_2b0.field_2._M_allocated_capacity = *puVar7;
          local_2b0._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_2b0._M_string_length = puVar6[1];
        *puVar6 = puVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_270[0]);
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        psVar8 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_2d0.field_2._M_allocated_capacity = *psVar8;
          local_2d0.field_2._8_8_ = puVar6[3];
        }
        else {
          local_2d0.field_2._M_allocated_capacity = *psVar8;
          local_2d0._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_2d0._M_string_length = puVar6[1];
        *puVar6 = psVar8;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228,
                   &local_2d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002ecbc6;
      case BASE_TYPE_UNION:
        std::operator+(&local_2b0,"let __",&local_248);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b0);
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_2d0.field_2._M_allocated_capacity = *psVar8;
          local_2d0.field_2._8_8_ = plVar5[3];
        }
        else {
          local_2d0.field_2._M_allocated_capacity = *psVar8;
          local_2d0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_2d0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_2d0,(ulong)local_248._M_dataplus._M_p);
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_2f0.field_2._M_allocated_capacity = *psVar8;
          local_2f0.field_2._8_8_ = plVar5[3];
        }
        else {
          local_2f0.field_2._M_allocated_capacity = *psVar8;
          local_2f0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_2f0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_2f0);
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_180.field_2._M_allocated_capacity = *psVar8;
          local_180.field_2._8_8_ = plVar5[3];
        }
        else {
          local_180.field_2._M_allocated_capacity = *psVar8;
          local_180._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_180._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        CodeWriter::operator+=(local_1f0,&local_180);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_2d0,"if let o = obj.",&local_248);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_2d0);
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_2f0.field_2._M_allocated_capacity = *psVar8;
          local_2f0.field_2._8_8_ = plVar5[3];
        }
        else {
          local_2f0.field_2._M_allocated_capacity = *psVar8;
          local_2f0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_2f0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228,
                   &local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_2b0,"  {{STRUCTNAME}}.add(",&local_248);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b0);
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_2d0.field_2._M_allocated_capacity = *psVar8;
          local_2d0.field_2._8_8_ = plVar5[3];
        }
        else {
          local_2d0.field_2._M_allocated_capacity = *psVar8;
          local_2d0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_2d0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_270[0]);
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_2f0.field_2._M_allocated_capacity = *psVar8;
          local_2f0.field_2._8_8_ = plVar5[3];
        }
        else {
          local_2f0.field_2._M_allocated_capacity = *psVar8;
          local_2f0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_2f0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228,
                   &local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_290,"  {{STRUCTNAME}}.",&local_210);
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        puVar7 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_2b0.field_2._M_allocated_capacity = *puVar7;
          local_2b0.field_2._8_8_ = puVar6[3];
        }
        else {
          local_2b0.field_2._M_allocated_capacity = *puVar7;
          local_2b0._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_2b0._M_string_length = puVar6[1];
        *puVar6 = puVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2b0,(ulong)local_248._M_dataplus._M_p);
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        psVar8 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_2d0.field_2._M_allocated_capacity = *psVar8;
          local_2d0.field_2._8_8_ = puVar6[3];
        }
        else {
          local_2d0.field_2._M_allocated_capacity = *psVar8;
          local_2d0._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_2d0._M_string_length = puVar6[1];
        *puVar6 = psVar8;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_270[0]);
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        puVar7 = (ulong *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_2f0.field_2._M_allocated_capacity = *puVar7;
          local_2f0.field_2._8_8_ = plVar5[3];
        }
        else {
          local_2f0.field_2._M_allocated_capacity = *puVar7;
          local_2f0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_2f0._M_string_length = plVar5[1];
        *plVar5 = (long)puVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228,
                   &local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"}\n","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228,
                   &local_2f0);
LAB_002ecbc6:
        uVar10 = local_2f0.field_2._M_allocated_capacity;
        _Var11._M_p = local_2f0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
LAB_002ecfe5:
          operator_delete(_Var11._M_p,uVar10 + 1);
        }
        break;
      default:
        if (BVar1 != BASE_TYPE_UTYPE) {
          std::operator+(&local_290,"{{STRUCTNAME}}.",&local_210);
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          puVar7 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar7) {
            local_2b0.field_2._M_allocated_capacity = *puVar7;
            local_2b0.field_2._8_8_ = puVar6[3];
          }
          else {
            local_2b0.field_2._M_allocated_capacity = *puVar7;
            local_2b0._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_2b0._M_string_length = puVar6[1];
          *puVar6 = puVar7;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_2b0,(ulong)local_1e8._M_dataplus._M_p);
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          psVar8 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_2d0.field_2._M_allocated_capacity = *psVar8;
            local_2d0.field_2._8_8_ = puVar6[3];
          }
          else {
            local_2d0.field_2._M_allocated_capacity = *psVar8;
            local_2d0._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_2d0._M_string_length = puVar6[1];
          *puVar6 = psVar8;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_270[0]);
          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          puVar7 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar7) {
            local_2f0.field_2._M_allocated_capacity = *puVar7;
            local_2f0.field_2._8_8_ = puVar6[3];
          }
          else {
            local_2f0.field_2._M_allocated_capacity = *puVar7;
            local_2f0._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_2f0._M_string_length = puVar6[1];
          *puVar6 = puVar7;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228
                     ,&local_2f0);
          goto LAB_002ecf7d;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      ppFVar13 = local_d8;
      this_01 = local_e0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if (local_100[0] != local_f0) {
        operator_delete(local_100[0],local_f0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
LAB_002ed0d3:
      ppFVar13 = ppFVar13 + 1;
    } while (ppFVar13 !=
             (local_1a8->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"let __root = {{STRUCTNAME}}.start{{SHORT_STRUCTNAME}}(&builder)",
             "");
  pSVar4 = local_250;
  this_00 = &local_250->code_;
  CodeWriter::operator+=(this_00,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start <
      local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar12 = local_228.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar3 = (pbVar12->_M_dataplus)._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar3,pcVar3 + pbVar12->_M_string_length);
      CodeWriter::operator+=(this_00,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      pbVar12 = pbVar12 + 1;
    } while (pbVar12 < local_228.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "return {{STRUCTNAME}}.end{{SHORT_STRUCTNAME}}(&builder, start: __root)","");
  CodeWriter::operator+=(this_00,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  iVar2 = (pSVar4->code_).cur_ident_lvl_;
  if (iVar2 != 0) {
    (pSVar4->code_).cur_ident_lvl_ = iVar2 + -1;
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"}","");
  CodeWriter::operator+=(this_00,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_270[0] != local_260) {
    operator_delete(local_270[0],local_260[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  return;
}

Assistant:

void GenerateObjectAPITableExtension(const StructDef &struct_def) {
    GenerateObjectAPIExtensionHeader(namer_.NamespacedObjectType(struct_def));
    std::vector<std::string> unpack_body;
    std::string builder = ", &builder)";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) continue;
      const auto field_var = namer_.Variable(field);
      const auto field_field = namer_.Field(field);
      const auto field_method = namer_.Method(field);
      const auto type = GenType(field.value.type);
      std::string check_if_vector =
          (IsVector(field.value.type) || IsArray(field.value.type))
              ? "VectorOf("
              : "(";
      std::string body = "add" + check_if_vector + field_method + ": ";
      switch (field.value.type.base_type) {
        case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();
        case BASE_TYPE_VECTOR: {
          GenerateVectorObjectAPITableExtension(field);
          unpack_body.push_back("{{STRUCTNAME}}." + body + "__" + field_var +
                                builder);
          break;
        }
        case BASE_TYPE_UNION: {
          code_ += "let __" + field_var + " = obj." + field_var +
                   "?.pack(builder: &builder) ?? Offset()";
          unpack_body.push_back("if let o = obj." + field_var + "?.type {");
          unpack_body.push_back("  {{STRUCTNAME}}.add(" + field_var +
                                "Type: o" + builder);
          unpack_body.push_back("  {{STRUCTNAME}}." + body + "__" + field_var +
                                builder);
          unpack_body.push_back("}\n");
          break;
        }
        case BASE_TYPE_STRUCT: {
          if (field.value.type.struct_def &&
              field.value.type.struct_def->fixed) {
            // This is a Struct (IsStruct), not a table. We create
            // a native swift object in this case.
            std::string code;
            GenerateStructArgs(*field.value.type.struct_def, &code, "", "",
                               "$0", true);
            code = code.substr(0, code.size() - 2);
            unpack_body.push_back("{{STRUCTNAME}}." + body + "obj." +
                                  field_field + builder);
          } else {
            code_ += "let __" + field_var + " = " + type +
                     ".pack(&builder, obj: &obj." + field_field + ")";
            unpack_body.push_back("{{STRUCTNAME}}." + body + "__" + field_var +
                                  builder);
          }
          break;
        }
        case BASE_TYPE_STRING: {
          unpack_body.push_back("{{STRUCTNAME}}." + body + "__" + field_var +
                                builder);
          if (field.IsRequired()) {
            code_ += "let __" + field_var + " = builder.create(string: obj." +
                     field_field + ")";
          } else {
            BuildingOptionalObjects(field_field, "builder.create(string: s)");
          }
          break;
        }
        case BASE_TYPE_UTYPE: break;
        default:
          unpack_body.push_back("{{STRUCTNAME}}." + body + "obj." +
                                field_field + builder);
      }
    }
    code_ += "let __root = {{STRUCTNAME}}.start{{SHORT_STRUCTNAME}}(&builder)";
    for (auto it = unpack_body.begin(); it < unpack_body.end(); it++)
      code_ += *it;
    code_ +=
        "return {{STRUCTNAME}}.end{{SHORT_STRUCTNAME}}(&builder, start: "
        "__root)";
    Outdent();
    code_ += "}";
  }